

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::BeginRenderPass
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,BeginRenderPassAttribs *Attribs)

{
  RENDER_DEVICE_TYPE RVar1;
  RESOURCE_STATE RequiredState;
  ITextureView *pIVar2;
  COMMAND_QUEUE_TYPE CVar3;
  bool bVar4;
  int iVar5;
  RenderPassGLImpl *pRVar6;
  FramebufferGLImpl *pFVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TextureBaseGL *Texture;
  COMMAND_QUEUE_TYPE in_DL;
  COMMAND_QUEUE_TYPE extraout_DL;
  Uint32 i;
  ulong uVar8;
  char *in_R8;
  char (*in_R9) [8];
  Uint32 *Args;
  long lVar9;
  char (*in_stack_ffffffffffffff58) [2];
  string msg;
  String local_50;
  
  CVar3 = (this->m_Desc).QueueType;
  if (CVar3 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&msg,(char (*) [79])
                      "Queue type may never be unknown for immediate contexts. This looks like a bug."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BeginRenderPass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x5b8);
      std::__cxx11::string::~string((string *)&msg);
    }
    FormatString<char[97]>
              (&msg,(char (*) [97])
                    "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x5b8);
    std::__cxx11::string::~string((string *)&msg);
    CVar3 = (this->m_Desc).QueueType;
    in_DL = extraout_DL;
  }
  if ((~CVar3 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_50,(Diligent *)(ulong)CVar3,in_DL);
    in_R8 = " queue.";
    FormatString<char[16],char[22],std::__cxx11::string,char[8]>
              (&msg,(Diligent *)0x6e9de2,(char (*) [16])0x7e8bba,(char (*) [22])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)&local_50);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x5b8);
    std::__cxx11::string::~string((string *)&msg);
  }
  pRVar6 = (this->m_pActiveRenderPass).m_pObject;
  if (pRVar6 != (RenderPassGLImpl *)0x0) {
    FormatString<char[61],char_const*,char[14]>
              (&msg,(Diligent *)"Attempting to begin render pass while another render pass (\'",
               (char (*) [61])
               &(pRVar6->super_RenderPassBase<Diligent::EngineGLImplTraits>).
                super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
                .m_Desc,(char **)"\') is active.",(char (*) [14])in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x5b9);
    std::__cxx11::string::~string((string *)&msg);
  }
  pFVar7 = (this->m_pBoundFramebuffer).m_pObject;
  if (pFVar7 != (FramebufferGLImpl *)0x0) {
    FormatString<char[61],char_const*,char[13]>
              (&msg,(Diligent *)"Attempting to begin render pass while another framebuffer (\'",
               (char (*) [61])
               &(pFVar7->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                .m_Desc,(char **)"\') is bound.",(char (*) [13])in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x5ba);
    std::__cxx11::string::~string((string *)&msg);
  }
  VerifyBeginRenderPassAttribs(Attribs);
  (*(this->super_ObjectBase<Diligent::IDeviceContextGL>).
    super_RefCountedObject<Diligent::IDeviceContextGL>.super_IDeviceContextGL.super_IDeviceContext.
    super_IObject._vptr_IObject[0x51])();
  pRVar6 = ClassPtrCast<Diligent::RenderPassGLImpl,Diligent::IRenderPass>(Attribs->pRenderPass);
  pFVar7 = ClassPtrCast<Diligent::FramebufferGLImpl,Diligent::IFramebuffer>(Attribs->pFramebuffer);
  if (Attribs->StateTransitionMode != RESOURCE_STATE_TRANSITION_MODE_NONE) {
    Args = &(pFVar7->super_FramebufferBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
            .m_Desc.AttachmentCount;
    if ((pFVar7->super_FramebufferBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
        .m_Desc.AttachmentCount <
        (pRVar6->super_RenderPassBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
        .m_Desc.AttachmentCount) {
      FormatString<char[28],unsigned_int,char[96],unsigned_int,char[2]>
                (&msg,(Diligent *)"The number of attachments (",(char (*) [28])Args,
                 (uint *)
                 ") in currently bound framebuffer is smaller than the number of attachments in the render pass ("
                 ,(char (*) [96])
                  &(pRVar6->super_RenderPassBase<Diligent::EngineGLImplTraits>).
                   super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
                   .m_Desc.AttachmentCount,(uint *)0x801c00,in_stack_ffffffffffffff58);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BeginRenderPass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x5c9);
      std::__cxx11::string::~string((string *)&msg);
    }
    RVar1 = (((this->m_pDevice).m_pObject)->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
            m_DeviceInfo.Type;
    lVar9 = 8;
    for (uVar8 = 0; uVar8 < *Args; uVar8 = uVar8 + 1) {
      pIVar2 = (pFVar7->super_FramebufferBase<Diligent::EngineGLImplTraits>).
               super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
               .m_Desc.ppAttachments[uVar8];
      if (pIVar2 != (ITextureView *)0x0) {
        if (RVar1 == RENDER_DEVICE_TYPE_METAL) {
          iVar5 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar2);
          if (*(char *)(CONCAT44(extraout_var,iVar5) + 8) == '\x06') goto LAB_002ff5a5;
        }
        iVar5 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[10])(pIVar2);
        Texture = ClassPtrCast<Diligent::TextureBaseGL,Diligent::ITexture>
                            ((ITexture *)CONCAT44(extraout_var_00,iVar5));
        RequiredState =
             *(RESOURCE_STATE *)
              ((long)&((pRVar6->super_RenderPassBase<Diligent::EngineGLImplTraits>).
                       super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
                       .m_Desc.pAttachments)->Format + lVar9);
        if (Attribs->StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_VERIFY) {
          DvpVerifyTextureState(this,Texture,RequiredState,"BeginRenderPass");
        }
        else if ((Attribs->StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION) &&
                ((Texture->super_TextureBase<Diligent::EngineGLImplTraits>).m_State !=
                 RESOURCE_STATE_UNKNOWN)) {
          bVar4 = TextureBase<Diligent::EngineGLImplTraits>::CheckState
                            (&Texture->super_TextureBase<Diligent::EngineGLImplTraits>,RequiredState
                            );
          if (!bVar4) {
            msg._M_dataplus._M_p = (pointer)0x0;
            msg.field_2._M_allocated_capacity._0_4_ = 0;
            msg.field_2._M_allocated_capacity._4_4_ = 0xffffffff;
            msg.field_2._8_4_ = 0;
            msg.field_2._12_4_ = 0xffffffff;
            msg._M_string_length = (size_type)Texture;
            (*(this->super_ObjectBase<Diligent::IDeviceContextGL>).
              super_RefCountedObject<Diligent::IDeviceContextGL>.super_IDeviceContextGL.
              super_IDeviceContext.super_IObject._vptr_IObject[0x36])(this,1,&msg);
          }
        }
      }
LAB_002ff5a5:
      lVar9 = lVar9 + 0x10;
    }
  }
  RefCntAutoPtr<Diligent::RenderPassGLImpl>::operator=(&this->m_pActiveRenderPass,pRVar6);
  RefCntAutoPtr<Diligent::FramebufferGLImpl>::operator=(&this->m_pBoundFramebuffer,pFVar7);
  this->m_SubpassIndex = 0;
  this->m_RenderPassAttachmentsTransitionMode = Attribs->StateTransitionMode;
  UpdateAttachmentStates(this,0);
  SetSubpassRenderTargets(this);
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::BeginRenderPass(const BeginRenderPassAttribs& Attribs)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "BeginRenderPass");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "Attempting to begin render pass while another render pass ('", m_pActiveRenderPass->GetDesc().Name, "') is active.");
    DEV_CHECK_ERR(m_pBoundFramebuffer == nullptr, "Attempting to begin render pass while another framebuffer ('", m_pBoundFramebuffer->GetDesc().Name, "') is bound.");

    VerifyBeginRenderPassAttribs(Attribs);

    // Reset current render targets (in Vulkan backend, this may end current render pass).
    ResetRenderTargets();

    RenderPassImplType*  pNewRenderPass  = ClassPtrCast<RenderPassImplType>(Attribs.pRenderPass);
    FramebufferImplType* pNewFramebuffer = ClassPtrCast<FramebufferImplType>(Attribs.pFramebuffer);
    if (Attribs.StateTransitionMode != RESOURCE_STATE_TRANSITION_MODE_NONE)
    {
        const RenderPassDesc&  RPDesc = pNewRenderPass->GetDesc();
        const FramebufferDesc& FBDesc = pNewFramebuffer->GetDesc();
        DEV_CHECK_ERR(RPDesc.AttachmentCount <= FBDesc.AttachmentCount,
                      "The number of attachments (", FBDesc.AttachmentCount,
                      ") in currently bound framebuffer is smaller than the number of attachments in the render pass (", RPDesc.AttachmentCount, ")");
        const bool IsMetal = m_pDevice->GetDeviceInfo().IsMetalDevice();
        for (Uint32 i = 0; i < FBDesc.AttachmentCount; ++i)
        {
            ITextureView* pView = FBDesc.ppAttachments[i];
            if (pView == nullptr)
                continue;

            if (IsMetal && pView->GetDesc().ViewType == TEXTURE_VIEW_SHADING_RATE)
                continue;

            TextureImplType* pTex          = ClassPtrCast<TextureImplType>(pView->GetTexture());
            RESOURCE_STATE   RequiredState = RPDesc.pAttachments[i].InitialState;
            if (Attribs.StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION)
            {
                if (pTex->IsInKnownState() && !pTex->CheckState(RequiredState))
                {
                    StateTransitionDesc Barrier{pTex, RESOURCE_STATE_UNKNOWN, RequiredState, STATE_TRANSITION_FLAG_UPDATE_STATE};
                    this->TransitionResourceStates(1, &Barrier);
                }
            }
            else if (Attribs.StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_VERIFY)
            {
                DvpVerifyTextureState(*pTex, RequiredState, "BeginRenderPass");
            }
        }
    }

    m_pActiveRenderPass                   = pNewRenderPass;
    m_pBoundFramebuffer                   = pNewFramebuffer;
    m_SubpassIndex                        = 0;
    m_RenderPassAttachmentsTransitionMode = Attribs.StateTransitionMode;

    UpdateAttachmentStates(m_SubpassIndex);
    SetSubpassRenderTargets();
}